

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

uint8_t * __thiscall
pktalloc::Allocator::Reallocate(Allocator *this,uint8_t *ptr,uint bytes,Realloc behavior)

{
  uint uVar1;
  uint8_t *__dest;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  Allocator *unaff_retaddr;
  uint8_t *newPtr;
  uint requestedUnits;
  uint existingUnits;
  AllocationHeader *regionHeader;
  Allocator *in_stack_fffffffffffffff8;
  uint bytes_00;
  
  bytes_00 = (uint)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_RSI == (uint8_t *)0x0) {
    in_RSI = Allocate(unaff_retaddr,bytes_00);
  }
  else if (in_EDX == 0) {
    Free(in_stack_fffffffffffffff8,in_RDI);
    in_RSI = (uint8_t *)0x0;
  }
  else {
    uVar1 = *(uint *)(in_RSI + -0x18);
    if (uVar1 < (in_EDX + 0x1fU >> 5) + 1) {
      __dest = Allocate(unaff_retaddr,bytes_00);
      if (__dest == (uint8_t *)0x0) {
        in_RSI = (uint8_t *)0x0;
      }
      else {
        if (in_ECX == 1) {
          memcpy(__dest,in_RSI,(ulong)((uVar1 - 1) * 0x20));
        }
        Free(in_stack_fffffffffffffff8,in_RDI);
        in_RSI = __dest;
      }
    }
  }
  return in_RSI;
}

Assistant:

uint8_t* Allocator::Reallocate(uint8_t* ptr, unsigned bytes, Realloc behavior)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    if (!ptr) {
        return Allocate(bytes);
    }
    if (bytes <= 0) {
        Free(ptr);
        return nullptr;
    }
    PKTALLOC_DEBUG_ASSERT((uintptr_t)ptr % kUnitSize == 0);

    AllocationHeader* regionHeader = (AllocationHeader*)(ptr - kUnitSize);
#ifdef PKTALLOC_DEBUG
    if (regionHeader->Canary != AllocationHeader::kCanaryExpected) {
        PKTALLOC_DEBUG_BREAK(); // Buffer overflow detected
        return nullptr;
    }
    if (regionHeader->IsFreed()) {
        PKTALLOC_DEBUG_BREAK(); // Double-free
        return nullptr;
    }
#endif // PKTALLOC_DEBUG

    const unsigned existingUnits = regionHeader->UsedUnits;
#ifndef PKTALLOC_DISABLE
    PKTALLOC_DEBUG_ASSERT(!regionHeader->Header || existingUnits <= kFallbackThresholdUnits);
#endif // PKTALLOC_DISABLE

    // If the existing allocation is big enough:
    const unsigned requestedUnits = (bytes + kUnitSize - 1) / kUnitSize + 1;
    if (requestedUnits <= existingUnits) {
        return ptr; // No change needed
    }

    // Allocate new data
    uint8_t* newPtr = Allocate(bytes);
    if (!newPtr) {
        return nullptr;
    }

    // Copy old data
    if (behavior == Realloc::CopyExisting) {
        memcpy(newPtr, ptr, (existingUnits - 1) * kUnitSize);
    }

    Free(ptr);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return newPtr;
}